

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSpan.h
# Opt level: O2

void __thiscall
TimeSpan::CalculateTicks(TimeSpan *this,int days,int hours,int minutes,int seconds,int microseconds)

{
  this->m_ticks =
       (long)microseconds + (long)days * 86400000000 +
       ((long)seconds + (long)minutes * 0x3c + (long)hours * 0xe10) * 1000000;
  return;
}

Assistant:

void CalculateTicks(int days,
            int hours,
            int minutes,
            int seconds,
            int microseconds)
    {
        m_ticks = days * TicksPerDay +
            (hours * 3600LL + minutes * 60LL + seconds) * TicksPerSecond + 
            microseconds * TicksPerMicrosecond;
    }